

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O0

void InitUndistortRectifyMap(Mat *K,Mat *D,Mat *xi,Mat *R,Mat *P,Size *size,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  float *pfVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double v;
  double u;
  double yd;
  double xd;
  double r4;
  double r2;
  double yu;
  double xu;
  double zs;
  double ys;
  double xs;
  double rr;
  double local_568;
  double zc;
  double local_500;
  double yc;
  double local_498;
  double xc;
  int c;
  int r;
  MatExpr local_328 [352];
  MatExpr local_1c8 [8];
  Mat KRi;
  double p2;
  double p1;
  double k2;
  double k1;
  double xid;
  double s;
  double cy;
  double cx;
  double fy;
  double fx;
  Mat local_110 [112];
  Size_<int> local_a0;
  Mat local_98 [96];
  Size *local_38;
  Size *size_local;
  Mat *P_local;
  Mat *R_local;
  Mat *xi_local;
  Mat *D_local;
  Mat *K_local;
  
  local_38 = size;
  size_local = (Size *)P;
  P_local = R;
  R_local = xi;
  xi_local = D;
  D_local = K;
  cv::Size_<int>::Size_(&local_a0,size);
  cv::Mat::Mat(local_98,&local_a0,5);
  cv::Mat::operator=(map1,local_98);
  cv::Mat::~Mat(local_98);
  cv::Size_<int>::Size_((Size_<int> *)&fx,size);
  cv::Mat::Mat(local_110,(Size_<int> *)&fx,5);
  cv::Mat::operator=(map2,local_110);
  cv::Mat::~Mat(local_110);
  pdVar11 = cv::Mat::at<double>(K,0,0);
  dVar1 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(K,1,1);
  dVar2 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(K,0,2);
  dVar3 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(K,1,2);
  dVar4 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(K,0,1);
  dVar5 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(xi,0,0);
  dVar6 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(D,0,0);
  dVar7 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(D,0,1);
  dVar8 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(D,0,2);
  dVar9 = *pdVar11;
  pdVar11 = cv::Mat::at<double>(D,0,3);
  dVar10 = *pdVar11;
  cv::operator*((Mat *)&c,P);
  cv::MatExpr::inv((int)local_328);
  cv::MatExpr::operator_cast_to_Mat(local_1c8);
  cv::MatExpr::~MatExpr(local_328);
  cv::MatExpr::~MatExpr((MatExpr *)&c);
  for (xc._4_4_ = 0; xc._4_4_ < size->height; xc._4_4_ = xc._4_4_ + 1) {
    for (xc._0_4_ = 0; xc._0_4_ < size->width; xc._0_4_ = xc._0_4_ + 1) {
      cv::Mat::Mat((Mat *)&yc,(Mat *)local_1c8);
      dVar13 = MatRowMul((Mat *)&yc,(double)xc._0_4_,(double)xc._4_4_,1.0,0);
      cv::Mat::~Mat((Mat *)&yc);
      local_498 = dVar13;
      cv::Mat::Mat((Mat *)&zc,(Mat *)local_1c8);
      dVar13 = MatRowMul((Mat *)&zc,(double)xc._0_4_,(double)xc._4_4_,1.0,1);
      cv::Mat::~Mat((Mat *)&zc);
      local_500 = dVar13;
      cv::Mat::Mat((Mat *)&rr,(Mat *)local_1c8);
      dVar13 = MatRowMul((Mat *)&rr,(double)xc._0_4_,(double)xc._4_4_,1.0,2);
      cv::Mat::~Mat((Mat *)&rr);
      local_568 = dVar13;
      dVar13 = sqrt(dVar13 * dVar13 + local_498 * local_498 + local_500 * local_500);
      dVar14 = (local_498 / dVar13) / (local_568 / dVar13 + dVar6);
      dVar13 = (local_500 / dVar13) / (local_568 / dVar13 + dVar6);
      dVar15 = dVar14 * dVar14 + dVar13 * dVar13;
      dVar16 = dVar9 * ((dVar13 + dVar13) * dVar13 + dVar15) +
               (dVar8 * dVar15 * dVar15 + dVar7 * dVar15 + 1.0) * dVar13 +
               (dVar10 + dVar10) * dVar14 * dVar13;
      pfVar12 = cv::Mat::at<float>(map1,xc._4_4_,xc._0_4_);
      *pfVar12 = (float)(dVar1 * (dVar10 * ((dVar14 + dVar14) * dVar14 + dVar15) +
                                 (dVar8 * dVar15 * dVar15 + dVar7 * dVar15 + 1.0) * dVar14 +
                                 (dVar9 + dVar9) * dVar14 * dVar13) + dVar5 * dVar16 + dVar3);
      pfVar12 = cv::Mat::at<float>(map2,xc._4_4_,xc._0_4_);
      *pfVar12 = (float)(dVar2 * dVar16 + dVar4);
    }
  }
  cv::Mat::~Mat((Mat *)local_1c8);
  return;
}

Assistant:

void InitUndistortRectifyMap(cv::Mat K, cv::Mat D, cv::Mat xi, cv::Mat R,
                             cv::Mat P, cv::Size size,
                             cv::Mat& map1, cv::Mat& map2) {
  map1 = cv::Mat(size, CV_32F);
  map2 = cv::Mat(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double xid = xi.at<double>(0,0);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat KRi = (P * R).inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = MatRowMul(KRi, c, r, 1., 0);
      double yc = MatRowMul(KRi, c, r, 1., 1);
      double zc = MatRowMul(KRi, c, r, 1., 2);

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xid);
      double yu = ys / (zs + xid);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}